

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall Sudoku::restart(Sudoku *this)

{
  uint *puVar1;
  sudoku_policko sVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  Sudoku temp;
  
  uVar4 = 0;
  memset(&temp,0,0x1bc);
  while( true ) {
    uVar3 = (ushort)uVar4;
    if (uVar4 == 0x51) break;
    if (((uint)(this->s).pole[uVar4] & 0x10) != 0) {
      sVar2 = (this->s).pole[uVar4];
      temp.s.pole[uVar4] = sVar2;
      uVar5 = 1 << (sVar2._0_1_ & 0xf);
      puVar1 = temp.s.radky + (byte)((uVar3 & 0xff) / 9);
      *puVar1 = *puVar1 | uVar5;
      puVar1 = (uint *)((long)&temp + uVar4 * 4 + (uVar4 / 9) * -0x24 + 0x144);
      *puVar1 = *puVar1 | uVar5;
      puVar1 = temp.s.ctverce[(byte)(((byte)((char)((uVar3 & 0xff) / 9) * -9) + uVar3 & 0xff) / 3)]
               + (byte)((uVar3 & 0xff) / 0x1b);
      *puVar1 = *puVar1 | uVar5;
      temp.s.doplnenych = temp.s.doplnenych + 1;
    }
    uVar4 = uVar4 + 1;
  }
  memcpy(this,&temp,0x1bc);
  return;
}

Assistant:

void Sudoku::restart( void )
{
  Sudoku temp(-1); // operace probiha kopirovanim do docasneho sudoku
  int x,y;
  for(int i = 0; i< 81; i++)// projdeme vse
  {
    if(s.pole[i].pevne)// narazime-li na pevne cislo
    {
      // prekopirujeme jeho stav
      temp.s.pole[i] = s.pole[i];
      x = i % 9;
      y = i / 9;
      // a nastavime zakazane hodnoty pro radky/sloupce/ctverce
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
      temp.s.doplnenych ++; // mame dalsi doplnene cislo
    }
  }
  // preneseni stavu z docasneho sudoku do puvodniho (tohoto)
  s = temp.s;
}